

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint generateFixedLitLenTree(HuffmanTree *tree)

{
  uint *puVar1;
  uint extraout_EAX;
  uint *bitlen;
  long lVar2;
  
  bitlen = (uint *)malloc(0x480);
  if (bitlen != (uint *)0x0) {
    lVar2 = 0;
    do {
      puVar1 = bitlen + lVar2;
      puVar1[0] = 8;
      puVar1[1] = 8;
      puVar1[2] = 8;
      puVar1[3] = 8;
      lVar2 = lVar2 + 4;
    } while (lVar2 != 0x90);
    lVar2 = 0x90;
    do {
      puVar1 = bitlen + lVar2;
      puVar1[0] = 9;
      puVar1[1] = 9;
      puVar1[2] = 9;
      puVar1[3] = 9;
      lVar2 = lVar2 + 4;
    } while (lVar2 != 0x100);
    lVar2 = 0x100;
    do {
      puVar1 = bitlen + lVar2;
      puVar1[0] = 7;
      puVar1[1] = 7;
      puVar1[2] = 7;
      puVar1[3] = 7;
      lVar2 = lVar2 + 4;
    } while (lVar2 != 0x118);
    lVar2 = 0x118;
    do {
      puVar1 = bitlen + lVar2;
      puVar1[0] = 8;
      puVar1[1] = 8;
      puVar1[2] = 8;
      puVar1[3] = 8;
      lVar2 = lVar2 + 4;
    } while (lVar2 != 0x120);
    HuffmanTree_makeFromLengths(tree,bitlen,0x120,0xf);
    free(bitlen);
    return extraout_EAX;
  }
  return 0;
}

Assistant:

static unsigned generateFixedLitLenTree(HuffmanTree* tree)
{
  unsigned i, error = 0;
  unsigned* bitlen = (unsigned*)lodepng_malloc(NUM_DEFLATE_CODE_SYMBOLS * sizeof(unsigned));
  if(!bitlen) return 83; /*alloc fail*/

  /*288 possible codes: 0-255=literals, 256=endcode, 257-285=lengthcodes, 286-287=unused*/
  for(i =   0; i <= 143; ++i) bitlen[i] = 8;
  for(i = 144; i <= 255; ++i) bitlen[i] = 9;
  for(i = 256; i <= 279; ++i) bitlen[i] = 7;
  for(i = 280; i <= 287; ++i) bitlen[i] = 8;

  error = HuffmanTree_makeFromLengths(tree, bitlen, NUM_DEFLATE_CODE_SYMBOLS, 15);

  lodepng_free(bitlen);
  return error;
}